

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

INCREMENT_TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_true>::ListIncrementValue
          (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this,idx_t row_idx)

{
  if ((ulong)((*(long *)(this->args + 8) - *(long *)this->args) / 0x68) < 3) {
    return 1;
  }
  if (**(long **)&this->field_0x98 != 0) {
    row_idx = (idx_t)*(uint *)(**(long **)&this->field_0x98 + row_idx * 4);
  }
  return *(INCREMENT_TYPE *)(*(long *)&this->field_0xa0 + row_idx * 8);
}

Assistant:

typename OP::INCREMENT_TYPE ListIncrementValue(idx_t row_idx) {
		if (args.ColumnCount() < 3) {
			return OP::DefaultIncrement();
		} else {
			auto data = (typename OP::INCREMENT_TYPE *)vdata[2].data;
			auto idx = vdata[2].sel->get_index(row_idx);
			return data[idx];
		}
	}